

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O2

int __thiscall chatter::Protocol::connect(Protocol *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  PeerState PVar1;
  undefined8 in_RAX;
  uint64_t uVar2;
  undefined8 extraout_RAX;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  Peer *pPVar3;
  int in_R8D;
  ProtocolChannelID in_stack_ffffffffffffffbb;
  int in_stack_ffffffffffffffbc;
  ptr p;
  __shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  pPVar3 = (Peer *)CONCAT44(in_register_00000034,__fd);
  PVar1 = pPVar3->m_state;
  if (PVar1 == DISCONNECTED) {
    pPVar3->m_state = CONNECTION_REQUESTED;
    uVar2 = Host::timestamp_now(this->m_host);
    pPVar3->m_connect_ts = uVar2;
    Packet::create(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffbb);
    (p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_peer = pPVar3;
    Packet::set_type(p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     CONNECT_REQUEST);
    Packet::set_flag(p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     RELIABLE);
    std::__shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,&p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>);
    send(this,(int)&local_30,(void *)0x1,CONCAT44(in_register_0000000c,__len),in_R8D);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    in_RAX = extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)in_RAX >> 8),PVar1 == DISCONNECTED);
}

Assistant:

bool Protocol::connect(Peer* peer)
{
    if (peer->m_state != PeerState::DISCONNECTED)
        return false;

    peer->m_state = PeerState::CONNECTION_REQUESTED;
    peer->m_connect_ts = m_host->timestamp_now();

    auto p = Packet::create();
    p->m_peer = peer;
    p->set_type(PacketType::CONNECT_REQUEST);
    p->set_flag(PacketFlag::RELIABLE);

    send(p, true);

    return true;
}